

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ArgMaxLayerParams::MergePartialFromCodedStream
          (ArgMaxLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  pair<unsigned_long,_bool> pVar11;
  pair<unsigned_long,_bool> pVar12;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001445c6;
      input->buffer_ = pbVar3 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001445c6:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    iVar10 = 6;
    iVar8 = iVar10;
    if ((uVar9 & 0x100000000) == 0) {
LAB_0014463a:
      iVar8 = 7;
      if (((uVar6 & 7) != 4 && uVar6 != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = iVar10
         , bVar5)) {
LAB_0014465f:
        iVar8 = 0;
      }
    }
    else {
      uVar7 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar9 != '\x10') goto LAB_0014463a;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar12._8_8_ = 1;
          pVar12.first = (long)(char)uVar2;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_00144661;
        this->removedim_ = pVar12.first != 0;
        goto LAB_0014465f;
      }
      if ((uVar7 != 1) || ((char)uVar9 != '\b')) goto LAB_0014463a;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar11._8_8_ = 1;
        pVar11.first = (long)(char)uVar2;
      }
      else {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->axis_ = pVar11.first;
        goto LAB_0014465f;
      }
    }
LAB_00144661:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool ArgMaxLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ArgMaxLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool removeDim = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &removedim_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ArgMaxLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ArgMaxLayerParams)
  return false;
#undef DO_
}